

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall
ON_PolyEdgeSegment::Create(ON_PolyEdgeSegment *this,ON_Curve *curve,ON_UUID *object_id)

{
  double t0;
  unsigned_short uVar1;
  unsigned_short uVar2;
  bool bVar3;
  ON_BrepEdge *this_00;
  ON_Brep *pOVar4;
  ON_Curve *real_curve;
  ON_COMPONENT_INDEX OVar5;
  double *pdVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  ON_Interval real_curve_subdomain;
  ON_Curve *c3;
  ON_Brep *brep;
  ON_BrepEdge *edge;
  ON_UUID *object_id_local;
  ON_Curve *curve_local;
  ON_PolyEdgeSegment *this_local;
  int extraout_var;
  
  Init(this);
  if (curve == (ON_Curve *)0x0) {
    return false;
  }
  this_00 = ON_BrepEdge::Cast((ON_Object *)curve);
  if (this_00 == (ON_BrepEdge *)0x0) {
    ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,curve);
  }
  else {
    pOVar4 = ON_BrepEdge::Brep(this_00);
    if (pOVar4 == (ON_Brep *)0x0) {
      return false;
    }
    real_curve = ON_BrepEdge::EdgeCurveOf(this_00);
    if (real_curve == (ON_Curve *)0x0) {
      return false;
    }
    this->m_edge = this_00;
    this->m_brep = pOVar4;
    OVar5.m_type = (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object
                     ._vptr_ON_Object[0x22])();
    OVar5.m_index = extraout_var;
    this->m_component_index = OVar5;
    (*(this->m_edge->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x25])();
    (this->m_edge_domain).m_t[0] = extraout_XMM0_Qa;
    (this->m_edge_domain).m_t[1] = in_XMM1_Qa;
    (*(this->m_trim->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x25])();
    (this->m_trim_domain).m_t[0] = extraout_XMM0_Qa_00;
    (this->m_trim_domain).m_t[1] = in_XMM1_Qa;
    real_curve_subdomain = ON_CurveProxy::ProxyCurveDomain(&this_00->super_ON_CurveProxy);
    ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,real_curve,real_curve_subdomain);
    bVar3 = ON_CurveProxy::ProxyCurveIsReversed(&this->m_edge->super_ON_CurveProxy);
    if (bVar3) {
      ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
    }
    pdVar6 = ON_Interval::operator[](&this->m_edge_domain,0);
    t0 = *pdVar6;
    pdVar6 = ON_Interval::operator[](&this->m_edge_domain,1);
    ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,t0,*pdVar6);
  }
  uVar1 = object_id->Data2;
  uVar2 = object_id->Data3;
  (this->m_object_id).Data1 = object_id->Data1;
  (this->m_object_id).Data2 = uVar1;
  (this->m_object_id).Data3 = uVar2;
  *(undefined8 *)(this->m_object_id).Data4 = *(undefined8 *)object_id->Data4;
  return true;
}

Assistant:

bool ON_PolyEdgeSegment::Create( 
          const ON_Curve* curve,
          const ON_UUID& object_id 
          )
{
  //bool rc = false;
  Init();
  if ( !curve )
    return false;
  const ON_BrepEdge* edge = ON_BrepEdge::Cast(curve);
  if ( edge )
  {
    const ON_Brep* brep = edge->Brep();
    if ( !brep )
      return false;
    const ON_Curve* c3 = edge->EdgeCurveOf();
    if ( !c3 )
      return false;
    m_edge = edge;
    m_brep = brep;
    m_component_index = edge->ComponentIndex();
    m_edge_domain = m_edge->Domain();
    m_trim_domain = m_trim->Domain();
    ON_CurveProxy::SetProxyCurve( 
                      c3,
                      edge->ProxyCurveDomain()
                      );    
    if ( m_edge->ProxyCurveIsReversed() )
      ON_CurveProxy::Reverse();
    ON_CurveProxy::SetDomain( m_edge_domain[0], m_edge_domain[1] );
  }
  else
  {
    ON_CurveProxy::SetProxyCurve(const_cast<ON_Curve*>(curve));   
  }
  m_object_id = object_id;
  return true;
}